

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,cmBuildOptions *buildOptions,bool verbose,string *presetName,
            bool listPresets)

{
  _Base_ptr __k;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  cmState *pcVar3;
  cmGlobalGenerator *pcVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  string *psVar9;
  iterator iVar10;
  iterator iVar11;
  cmValue cVar12;
  ostream *poVar13;
  char *extraout_RDX;
  undefined4 in_register_00000034;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *ostr_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string_view value;
  byte local_f21;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  string local_f18;
  pointer local_ef8;
  __uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_ef0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_ee8;
  _Base_ptr local_ee0;
  string projName;
  string cachePath;
  string local_e10;
  stringstream ostr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_de0;
  cmJSONState local_dd0;
  undefined1 local_d80 [16];
  _Base_ptr local_d70;
  _Base_ptr local_d68;
  __node_base local_d60;
  size_t local_d58;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  local_d50;
  _Rb_tree_node_base local_d18;
  pointer local_cf8;
  _Rb_tree_node_base local_ce8;
  __node_base local_cc8;
  _Rb_tree_node_base local_cb8;
  size_t local_c98;
  __node_base _Stack_c90;
  pointer local_c88;
  pointer pbStack_c80;
  pointer local_c78;
  pointer pbStack_c70;
  pointer local_c68;
  pointer pbStack_c60;
  _Base_ptr local_c58;
  _Base_ptr p_Stack_c50;
  _Base_ptr local_c48;
  pointer pbStack_c40;
  pointer local_c38;
  pointer pbStack_c30;
  _Base_ptr local_c28;
  _Base_ptr p_Stack_c20;
  _Alloc_hider local_c18;
  size_type local_c10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c08;
  pointer local_bf8;
  pointer pbStack_bf0;
  pointer local_be8;
  
  local_ef8 = (pointer)CONCAT44(in_register_00000034,jobs);
  ostr_00 = &local_de0;
  local_ee8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)targets;
  local_ee0 = (_Base_ptr)config;
  _ostr = (pointer)ostr_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"");
  SetHomeDirectory(this,(string *)&ostr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ostr != ostr_00) {
    operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0])
                          + 1);
  }
  _ostr = (pointer)ostr_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"");
  SetHomeOutputDirectory(this,(string *)&ostr);
  local_f21 = verbose;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ostr != ostr_00) {
    operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0])
                          + 1);
  }
  if (presetName->_M_string_length != 0 || listPresets) {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeDirectory(this,(string *)&ostr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ostr != &local_de0) {
      operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0]
                                    ) + 1);
    }
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeOutputDirectory(this,(string *)&ostr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ostr != &local_de0) {
      operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0]
                                    ) + 1);
    }
    local_dd0.doc._M_dataplus._M_p = (pointer)&local_dd0.doc.field_2;
    local_de0._M_local_buf[0] = '\0';
    local_dd0.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_dd0.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_dd0.parseStack.
    super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_dd0.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_dd0.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_dd0.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_dd0.doc._M_string_length = 0;
    local_dd0.doc.field_2._M_local_buf[0] = '\0';
    p_Var1 = (_Base_ptr)(local_d80 + 8);
    local_d80._8_4_ = _S_red;
    local_d70 = (_Base_ptr)0x0;
    local_d58 = 0;
    p_Var2 = &local_d50._M_impl.super__Rb_tree_header;
    local_d50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d50._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d18._M_left = &local_d18;
    local_d18._M_color = _S_red;
    local_d18._M_parent = (_Base_ptr)0x0;
    local_cf8 = (pointer)0x0;
    local_ce8._M_left = &local_ce8;
    local_ce8._M_color = _S_red;
    local_ce8._M_parent = (_Base_ptr)0x0;
    local_cc8._M_nxt = (_Hash_node_base *)0x0;
    local_cb8._M_left = &local_cb8;
    local_cb8._M_color = _S_red;
    local_cb8._M_parent = (_Base_ptr)0x0;
    local_c18._M_p = (pointer)&local_c08;
    local_c28 = (_Base_ptr)0x0;
    p_Stack_c20 = (_Base_ptr)0x0;
    local_c38 = (pointer)0x0;
    pbStack_c30 = (pointer)0x0;
    local_c48 = (_Base_ptr)0x0;
    pbStack_c40 = (pointer)0x0;
    local_c58 = (_Base_ptr)0x0;
    p_Stack_c50 = (_Base_ptr)0x0;
    local_c68 = (pointer)0x0;
    pbStack_c60 = (pointer)0x0;
    local_c78 = (pointer)0x0;
    pbStack_c70 = (pointer)0x0;
    local_c88 = (pointer)0x0;
    pbStack_c80 = (pointer)0x0;
    local_c98 = 0;
    _Stack_c90._M_nxt = (_Hash_node_base *)0x0;
    local_c10 = 0;
    local_c08._M_local_buf[0] = '\0';
    local_bf8 = (pointer)0x0;
    pbStack_bf0 = (pointer)0x0;
    local_be8 = (pointer)0x0;
    _ostr = (pointer)&local_de0;
    local_d68 = p_Var1;
    local_d60._M_nxt = (_Hash_node_base *)p_Var1;
    local_d50._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_d50._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    local_d18._M_right = local_d18._M_left;
    local_ce8._M_right = local_ce8._M_left;
    local_cb8._M_right = local_cb8._M_left;
    psVar9 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    bVar6 = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)&ostr,psVar9,false);
    if (bVar6) {
      if (listPresets) {
        bVar6 = false;
        cmCMakePresetsGraph::PrintBuildPresetList
                  ((cmCMakePresetsGraph *)&ostr,(PrintPrecedingNewline *)0x0);
        iVar7 = 0;
      }
      else {
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                 ::find(&local_d50,presetName);
        if ((_Rb_tree_header *)iVar10._M_node == p_Var2) {
          psVar9 = cmState::GetSourceDirectory_abi_cxx11_
                             ((this->State)._M_t.
                              super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                              super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
          cachePath._M_dataplus._M_p = (pointer)0x18;
          cachePath._M_string_length = (size_type)anon_var_dwarf_c3f60c;
          cachePath.field_2._M_allocated_capacity = 0;
          cachePath.field_2._8_8_ = psVar9->_M_string_length;
          projName.field_2._M_allocated_capacity = (long)&projName.field_2 + 8;
          projName._M_dataplus._M_p = (pointer)0x0;
          projName._M_string_length = 1;
          projName.field_2._M_local_buf[8] = '\"';
          views_01._M_len = 5;
          views_01._M_array = (iterator)&cachePath;
          cmCatViews(&local_f18,views_01);
          cmSystemTools::Error(&local_f18);
LAB_00314780:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f18._M_dataplus._M_p != &local_f18.field_2) {
            operator_delete(local_f18._M_dataplus._M_p,local_f18.field_2._M_allocated_capacity + 1);
          }
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)&ostr,(PrintPrecedingNewline *)0x0);
        }
        else {
          if ((char)iVar10._M_node[4]._M_color == _S_black) {
            psVar9 = cmState::GetSourceDirectory_abi_cxx11_
                               ((this->State)._M_t.
                                super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
            cachePath._M_dataplus._M_p = (pointer)0x22;
            cachePath._M_string_length = (size_type)anon_var_dwarf_c3f619;
            cachePath.field_2._M_allocated_capacity = 0;
            cachePath.field_2._8_8_ = psVar9->_M_string_length;
            projName.field_2._M_allocated_capacity = (long)&projName.field_2 + 8;
            projName._M_dataplus._M_p = (pointer)0x0;
            projName._M_string_length = 1;
            projName.field_2._M_local_buf[8] = '\"';
            views_00._M_len = 5;
            views_00._M_array = (iterator)&cachePath;
            cmCatViews(&local_f18,views_00);
            cmSystemTools::Error(&local_f18);
            goto LAB_00314780;
          }
          if (*(char *)&iVar10._M_node[0x18]._M_left == '\0') {
            cmStrCat<char_const(&)[34],std::__cxx11::string_const&,char_const(&)[27]>
                      (&cachePath,(char (*) [34])"Could not evaluate build preset \"",presetName,
                       (char (*) [27])"\": Invalid macro expansion");
            cmSystemTools::Error(&cachePath);
          }
          else {
            if (*(char *)&iVar10._M_node[0x12]._M_parent != '\0') {
              __k = iVar10._M_node + 0x14;
              iVar11 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                               *)local_d80,__k);
              if (iVar11._M_node == p_Var1) {
                psVar9 = cmState::GetSourceDirectory_abi_cxx11_
                                   ((this->State)._M_t.
                                    super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>
                                    .super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
                projName._M_dataplus._M_p._0_1_ = 0x22;
                cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                          (&cachePath,(char (*) [29])"No such configure preset in ",psVar9,
                           (char (*) [4])0x86e394,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (char *)&projName);
                cmSystemTools::Error(&cachePath);
              }
              else {
                if ((char)iVar11._M_node[4]._M_color != _S_black) {
                  if (*(char *)&iVar11._M_node[0x25]._M_left == '\0') {
                    cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[27]>
                              (&cachePath,(char (*) [38])"Could not evaluate configure preset \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __k,(char (*) [27])"\": Invalid macro expansion");
                    cmSystemTools::Error(&cachePath);
                    uVar14 = cachePath.field_2._M_allocated_capacity;
                    _Var15 = cachePath._M_dataplus;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)cachePath._M_dataplus._M_p != &cachePath.field_2) goto LAB_003145ee;
                    goto LAB_003145f6;
                  }
                  if (iVar11._M_node[0x1f]._M_parent != (_Base_ptr)0x0) {
                    std::__cxx11::string::_M_assign((string *)dir);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator=(&(this->UnprocessedPresetEnvironment)._M_t,
                              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&iVar10._M_node[0x12]._M_left);
                  ProcessPresetEnvironment(this);
                  if (((int)local_ef8 + 1U < 2) &&
                     (*(char *)&iVar10._M_node[0x15]._M_parent == '\x01')) {
                    local_ef8 = (pointer)(ulong)*(uint *)&iVar10._M_node[0x15].field_0x4;
                  }
                  if (*(long *)local_ee8 == *(long *)(local_ee8 + 8)) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (local_ee8,*(long *)local_ee8,iVar10._M_node[0x15]._M_left,
                               iVar10._M_node[0x15]._M_right);
                  }
                  if (local_ee0->_M_parent == (_Base_ptr)0x0) {
                    std::__cxx11::string::_M_assign((string *)local_ee0);
                  }
                  if ((buildOptions->Clean == false) &&
                     (*(char *)((long)&iVar10._M_node[0x17]._M_parent + 1) == '\x01')) {
                    buildOptions->Clean = *(bool *)&iVar10._M_node[0x17]._M_parent;
                  }
                  if ((buildOptions->ResolveMode == Default) &&
                     (*(char *)((long)&iVar10._M_node[0x18]._M_parent + 4) == '\x01')) {
                    buildOptions->ResolveMode =
                         *(PackageResolveMode *)&iVar10._M_node[0x18]._M_parent;
                  }
                  if ((!verbose) && (*(char *)((long)&iVar10._M_node[0x17]._M_parent + 3) == '\x01')
                     ) {
                    local_f21 = *(byte *)((long)&iVar10._M_node[0x17]._M_parent + 2);
                  }
                  pbVar5 = (nativeOptions->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  iVar7 = 1;
                  bVar6 = true;
                  if (pbVar5 == (nativeOptions->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               nativeOptions,pbVar5,iVar10._M_node[0x17]._M_left,
                               iVar10._M_node[0x17]._M_right);
                  }
                  goto LAB_003148fb;
                }
                psVar9 = cmState::GetSourceDirectory_abi_cxx11_
                                   ((this->State)._M_t.
                                    super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>
                                    .super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
                projName._M_dataplus._M_p._0_1_ = 0x22;
                cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                          (&cachePath,(char (*) [39])"Cannot use hidden configure preset in ",psVar9
                           ,(char (*) [4])0x86e394,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (char *)&projName);
                cmSystemTools::Error(&cachePath);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)cachePath._M_dataplus._M_p != &cachePath.field_2) {
                operator_delete(cachePath._M_dataplus._M_p,
                                cachePath.field_2._M_allocated_capacity + 1);
              }
              PrintPresetList(this,(cmCMakePresetsGraph *)&ostr);
              goto LAB_003145f6;
            }
            psVar9 = cmState::GetSourceDirectory_abi_cxx11_
                               ((this->State)._M_t.
                                super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
            projName._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char_const(&)[37],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                      (&cachePath,(char (*) [37])"Cannot use disabled build preset in ",psVar9,
                       (char (*) [4])0x86e394,presetName,(char *)&projName);
            cmSystemTools::Error(&cachePath);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cachePath._M_dataplus._M_p != &cachePath.field_2) {
            operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
          }
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)&ostr,(PrintPrecedingNewline *)0x0);
        }
        bVar6 = false;
        iVar7 = 1;
      }
    }
    else {
      psVar9 = cmState::GetSourceDirectory_abi_cxx11_
                         ((this->State)._M_t.
                          super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                          super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                          super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      cmJSONState::GetErrorMessage_abi_cxx11_(&local_f18,&local_dd0,true);
      cachePath._M_dataplus._M_p = (pointer)0x1c;
      cachePath._M_string_length = (size_type)anon_var_dwarf_20860;
      cachePath.field_2._M_allocated_capacity = 0;
      cachePath.field_2._8_8_ = psVar9->_M_string_length;
      views._M_len = 4;
      views._M_array = (iterator)&cachePath;
      cmCatViews(&projName,views);
      cmSystemTools::Error(&projName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)projName._M_dataplus._M_p != &projName.field_2) {
        operator_delete(projName._M_dataplus._M_p,projName.field_2._M_allocated_capacity + 1);
      }
      uVar14 = local_f18.field_2._M_allocated_capacity;
      _Var15._M_p = local_f18._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f18._M_dataplus._M_p != &local_f18.field_2) {
LAB_003145ee:
        operator_delete(_Var15._M_p,uVar14 + 1);
      }
LAB_003145f6:
      iVar7 = 1;
      bVar6 = false;
    }
LAB_003148fb:
    cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)&ostr);
    if (!bVar6) {
      return iVar7;
    }
  }
  bVar6 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," is not a directory\n",0x14);
    return 1;
  }
  FindCacheFile(&cachePath,dir);
  bVar6 = LoadCache(this,&cachePath);
  if (!bVar6) {
    iVar7 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not load cache\n",0x1c);
    goto LAB_00314fb6;
  }
  pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  _ostr = (pointer)ostr_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"CMAKE_GENERATOR","");
  cVar12 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ostr != ostr_00) {
    operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0])
                          + 1);
  }
  if (cVar12.Value == (string *)0x0) {
    iVar7 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n",0x2f);
    goto LAB_00314fb6;
  }
  CreateGlobalGenerator((cmake *)&gen,(string *)this,SUB81(cVar12.Value,0));
  if ((__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)
      gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
      _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not create CMAKE_GENERATOR \"",0x29);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,((cVar12.Value)->_M_dataplus)._M_p,
                         (cVar12.Value)->_M_string_length);
    iVar7 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"\n",2);
  }
  else {
    local_ef0._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
         _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
         super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0;
    SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             *)&local_ef0);
    if ((_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
        local_ef0._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl != (cmGlobalGenerator *)0x0)
    {
      (**(code **)(*(long *)local_ef0._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
    }
    local_ef0._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)0x0;
    pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    _ostr = (pointer)ostr_00;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"CMAKE_GENERATOR_INSTANCE","");
    cVar12 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ostr != ostr_00) {
      operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0]
                                    ) + 1);
    }
    if (cVar12.Value != (string *)0x0) {
      projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
      projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
      projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
      cmMakefile::cmMakefile
                ((cmMakefile *)&ostr,
                 (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                 (cmStateSnapshot *)&projName);
      pcVar4 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      iVar7 = (*pcVar4->_vptr_cmGlobalGenerator[8])(pcVar4,cVar12.Value,&ostr);
      cmMakefile::~cmMakefile((cmMakefile *)&ostr);
      if ((char)iVar7 == '\0') {
        iVar7 = 1;
        goto LAB_00314fa6;
      }
    }
    pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    _ostr = (pointer)ostr_00;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"CMAKE_GENERATOR_PLATFORM","");
    cVar12 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ostr != ostr_00) {
      operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0]
                                    ) + 1);
    }
    if (cVar12.Value != (string *)0x0) {
      projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
      projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
      projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
      cmMakefile::cmMakefile
                ((cmMakefile *)&ostr,
                 (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                 (cmStateSnapshot *)&projName);
      pcVar4 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      iVar7 = (*pcVar4->_vptr_cmGlobalGenerator[9])(pcVar4,cVar12.Value,&ostr);
      cmMakefile::~cmMakefile((cmMakefile *)&ostr);
      if ((char)iVar7 == '\0') {
        iVar7 = 1;
        goto LAB_00314fa6;
      }
    }
    pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    _ostr = (pointer)ostr_00;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"CMAKE_GENERATOR_TOOLSET","");
    cVar12 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ostr != ostr_00) {
      operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0]
                                    ) + 1);
    }
    if (cVar12.Value != (string *)0x0) {
      projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
      projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
      projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
      cmMakefile::cmMakefile
                ((cmMakefile *)&ostr,
                 (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                 (cmStateSnapshot *)&projName);
      pcVar4 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      iVar7 = (*pcVar4->_vptr_cmGlobalGenerator[10])(pcVar4,cVar12.Value,1,&ostr);
      cmMakefile::~cmMakefile((cmMakefile *)&ostr);
      if ((char)iVar7 == '\0') {
        iVar7 = 1;
        goto LAB_00314fa6;
      }
    }
    projName._M_dataplus._M_p = (pointer)&projName.field_2;
    projName._M_string_length = 0;
    projName.field_2._M_allocated_capacity =
         projName.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    _ostr = (pointer)ostr_00;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"CMAKE_PROJECT_NAME","");
    cVar12 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ostr != ostr_00) {
      operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,local_de0._M_local_buf[0]
                                    ) + 1);
    }
    if (cVar12.Value == (string *)0x0) {
      iVar7 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n",0x32);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&projName);
      pcVar3 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      _ostr = (pointer)ostr_00;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ostr,"CMAKE_VERBOSE_MAKEFILE","");
      cVar12 = cmState::GetCacheEntryValue(pcVar3,(string *)&ostr);
      if (cVar12.Value == (string *)0x0) {
        bVar6 = false;
      }
      else {
        value._M_str = extraout_RDX;
        value._M_len = (size_t)((cVar12.Value)->_M_dataplus)._M_p;
        bVar6 = cmValue::IsOn((cmValue *)(cVar12.Value)->_M_string_length,value);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_ostr != ostr_00) {
        operator_delete(_ostr,CONCAT71(local_de0._M_allocated_capacity._1_7_,
                                       local_de0._M_local_buf[0]) + 1);
      }
      pcVar4 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      iVar8 = (*pcVar4->_vptr_cmGlobalGenerator[0xb])
                        (pcVar4,(this->State)._M_t.
                                super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      iVar7 = 1;
      if ((char)iVar8 != '\0') {
        pcVar4 = (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        (*pcVar4->_vptr_cmGlobalGenerator[0x16])(pcVar4,&std::cerr,local_ef8);
        std::__cxx11::stringstream::stringstream((stringstream *)&ostr);
        if (bVar6 != false || (local_f21 & 1) != 0) {
          ostr_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&std::cout;
        }
        pcVar4 = (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        local_f18._M_dataplus._M_p = (pointer)&local_f18.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f18,"");
        local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e10,"");
        iVar7 = cmGlobalGenerator::Build
                          (pcVar4,(int)local_ef8,&local_f18,dir,&projName,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_ee8,(ostream *)ostr_00,&local_e10,(string *)local_ee0,
                           buildOptions,(bool)(bVar6 | local_f21 & 1),(cmDuration)0x0,
                           OUTPUT_PASSTHROUGH,nativeOptions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
          operator_delete(local_e10._M_dataplus._M_p,local_e10.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f18._M_dataplus._M_p != &local_f18.field_2) {
          operator_delete(local_f18._M_dataplus._M_p,local_f18.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ostr);
        std::ios_base::~ios_base((ios_base *)&local_d70);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projName._M_dataplus._M_p != &projName.field_2) {
      operator_delete(projName._M_dataplus._M_p,projName.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00314fa6:
  if ((__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)
      gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
      _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0) {
    (**(code **)(*(long *)gen._M_t.
                          super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
  }
LAB_00314fb6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cachePath._M_dataplus._M_p != &cachePath.field_2) {
    operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
  }
  return iVar7;
}

Assistant:

int cmake::Build(int jobs, std::string dir, std::vector<std::string> targets,
                 std::string config, std::vector<std::string> nativeOptions,
                 cmBuildOptions& buildOptions, bool verbose,
                 const std::string& presetName, bool listPresets)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");

#if !defined(CMAKE_BOOTSTRAP)
  if (!presetName.empty() || listPresets) {
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

    cmCMakePresetsGraph settingsFile;
    auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
    if (result != true) {
      cmSystemTools::Error(
        cmStrCat("Could not read presets from ", this->GetHomeDirectory(), ":",
                 settingsFile.parseState.GetErrorMessage()));
      return 1;
    }

    if (listPresets) {
      settingsFile.PrintBuildPresetList();
      return 0;
    }

    auto presetPair = settingsFile.BuildPresets.find(presetName);
    if (presetPair == settingsFile.BuildPresets.end()) {
      cmSystemTools::Error(cmStrCat("No such build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (presetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto const& expandedPreset = presetPair->second.Expanded;
    if (!expandedPreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate build preset \"",
                                    presetName,
                                    "\": Invalid macro expansion"));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (!expandedPreset->ConditionResult) {
      cmSystemTools::Error(cmStrCat("Cannot use disabled build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto configurePresetPair =
      settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
    if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
      cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    if (configurePresetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
    if (!expandedConfigurePreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                    expandedPreset->ConfigurePreset,
                                    "\": Invalid macro expansion"));
      return 1;
    }

    if (!expandedConfigurePreset->BinaryDir.empty()) {
      dir = expandedConfigurePreset->BinaryDir;
    }

    this->UnprocessedPresetEnvironment = expandedPreset->Environment;
    this->ProcessPresetEnvironment();

    if ((jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL ||
         jobs == cmake::NO_BUILD_PARALLEL_LEVEL) &&
        expandedPreset->Jobs) {
      jobs = *expandedPreset->Jobs;
    }

    if (targets.empty()) {
      targets.insert(targets.begin(), expandedPreset->Targets.begin(),
                     expandedPreset->Targets.end());
    }

    if (config.empty()) {
      config = expandedPreset->Configuration;
    }

    if (!buildOptions.Clean && expandedPreset->CleanFirst) {
      buildOptions.Clean = *expandedPreset->CleanFirst;
    }

    if (buildOptions.ResolveMode == PackageResolveMode::Default &&
        expandedPreset->ResolvePackageReferences) {
      buildOptions.ResolveMode = *expandedPreset->ResolvePackageReferences;
    }

    if (!verbose && expandedPreset->Verbose) {
      verbose = *expandedPreset->Verbose;
    }

    if (nativeOptions.empty()) {
      nativeOptions.insert(nativeOptions.begin(),
                           expandedPreset->NativeToolOptions.begin(),
                           expandedPreset->NativeToolOptions.end());
    }
  }
#endif

  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  cmValue cachedGenerator = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  auto gen = this->CreateGlobalGenerator(*cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \""
              << *cachedGenerator << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(std::move(gen));
  cmValue cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorInstance(*cachedGeneratorInstance,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorPlatform(*cachedGeneratorPlatform,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorToolset =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_TOOLSET");
  if (cachedGeneratorToolset) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorToolset(*cachedGeneratorToolset,
                                                    true, &mf)) {
      return 1;
    }
  }
  std::string projName;
  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = *cachedProjectName;

  if (this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE").IsOn()) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = cmStrCat("Build files have been written to: ",
                                     this->GetHomeOutputDirectory());
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  if (!this->GlobalGenerator->ReadCacheEntriesForBuild(*this->State)) {
    return 1;
  }

  this->GlobalGenerator->PrintBuildCommandAdvice(std::cerr, jobs);
  std::stringstream ostr;
  // `cmGlobalGenerator::Build` logs metadata about what directory and commands
  // are being executed to the `output` parameter. If CMake is verbose, print
  // this out.
  std::ostream& verbose_ostr = verbose ? std::cout : ostr;
  int buildresult = this->GlobalGenerator->Build(
    jobs, "", dir, projName, targets, verbose_ostr, "", config, buildOptions,
    verbose, cmDuration::zero(), cmSystemTools::OUTPUT_PASSTHROUGH,
    nativeOptions);

  return buildresult;
}